

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv.h
# Opt level: O2

int_mv gm_get_motion_vector
                 (WarpedMotionParams *gm,int allow_hp,BLOCK_SIZE bsize,int mi_col,int mi_row,
                 int is_integer)

{
  int iVar1;
  int iVar2;
  undefined4 in_EAX;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined8 uStack_28;
  
  if (gm->wmtype == '\x01') {
    auVar7._0_4_ = (uint)*(undefined8 *)gm->wmmat >> 0xd;
    auVar7._4_4_ = (uint)((ulong)*(undefined8 *)gm->wmmat >> 0x2d);
    auVar7._8_8_ = 0;
    auVar7 = pshuflw(auVar7,auVar7,0xe8);
    uStack_28 = CONCAT44(auVar7._0_4_,in_EAX);
  }
  else {
    if (gm->wmtype == '\0') {
      uStack_28 = 0;
      goto LAB_00330aae;
    }
    iVar6 = (uint)(block_size_wide[bsize] >> 1) + mi_col * 4 + -1;
    iVar3 = (uint)(block_size_high[bsize] >> 1) + mi_row * 4 + -1;
    iVar5 = gm->wmmat[4];
    iVar1 = gm->wmmat[5];
    iVar2 = gm->wmmat[1];
    uStack_28._0_4_ = in_EAX;
    iVar4 = convert_to_trans_prec
                      (allow_hp,(gm->wmmat[2] + -0x10000) * iVar6 + gm->wmmat[0] +
                                gm->wmmat[3] * iVar3);
    iVar5 = convert_to_trans_prec(allow_hp,iVar6 * iVar5 + iVar2 + (iVar1 + -0x10000) * iVar3);
    uStack_28 = CONCAT26((short)iVar4,CONCAT24((short)iVar5,(undefined4)uStack_28));
  }
  if (is_integer != 0) {
    integer_mv_precision((MV *)((long)&uStack_28 + 4));
  }
LAB_00330aae:
  return (int_mv)uStack_28._4_4_;
}

Assistant:

static inline int_mv gm_get_motion_vector(const WarpedMotionParams *gm,
                                          int allow_hp, BLOCK_SIZE bsize,
                                          int mi_col, int mi_row,
                                          int is_integer) {
  int_mv res;

  if (gm->wmtype == IDENTITY) {
    res.as_int = 0;
    return res;
  }

  const int32_t *mat = gm->wmmat;
  int x, y, tx, ty;

  if (gm->wmtype == TRANSLATION) {
    // All global motion vectors are stored with WARPEDMODEL_PREC_BITS (16)
    // bits of fractional precision. The offset for a translation is stored in
    // entries 0 and 1. For translations, all but the top three (two if
    // cm->features.allow_high_precision_mv is false) fractional bits are always
    // zero.
    //
    // After the right shifts, there are 3 fractional bits of precision. If
    // allow_hp is false, the bottom bit is always zero (so we don't need a
    // call to convert_to_trans_prec here)
    //
    // Note: There is an AV1 specification bug here:
    //
    // gm->wmmat[0] is supposed to be the horizontal translation, and so should
    // go into res.as_mv.col, and gm->wmmat[1] is supposed to be the vertical
    // translation and so should go into res.as_mv.row
    //
    // However, in the spec, these assignments are accidentally reversed, and so
    // we must keep this incorrect logic to match the spec.
    //
    // See also: https://crbug.com/aomedia/3328
    res.as_mv.row = gm->wmmat[0] >> GM_TRANS_ONLY_PREC_DIFF;
    res.as_mv.col = gm->wmmat[1] >> GM_TRANS_ONLY_PREC_DIFF;
    assert(IMPLIES(1 & (res.as_mv.row | res.as_mv.col), allow_hp));
    if (is_integer) {
      integer_mv_precision(&res.as_mv);
    }
    return res;
  }

  x = block_center_x(mi_col, bsize);
  y = block_center_y(mi_row, bsize);

  if (gm->wmtype == ROTZOOM) {
    assert(gm->wmmat[5] == gm->wmmat[2]);
    assert(gm->wmmat[4] == -gm->wmmat[3]);
  }

  const int xc =
      (mat[2] - (1 << WARPEDMODEL_PREC_BITS)) * x + mat[3] * y + mat[0];
  const int yc =
      mat[4] * x + (mat[5] - (1 << WARPEDMODEL_PREC_BITS)) * y + mat[1];
  tx = convert_to_trans_prec(allow_hp, xc);
  ty = convert_to_trans_prec(allow_hp, yc);

  res.as_mv.row = ty;
  res.as_mv.col = tx;

  if (is_integer) {
    integer_mv_precision(&res.as_mv);
  }
  return res;
}